

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# report_gl_error.h
# Opt level: O0

GLenum igl::opengl::report_gl_error(string *id)

{
  FILE *__stream;
  GLenum errorCode;
  undefined8 uVar1;
  char *pcVar2;
  anon_class_1_0_00000001 local_11;
  GLenum err;
  anon_class_1_0_00000001 gluErrorString;
  string *id_local;
  
  _err = id;
  errorCode = (*glad_glGetError)();
  __stream = _stderr;
  if (errorCode != 0) {
    uVar1 = std::__cxx11::string::c_str();
    pcVar2 = report_gl_error::anon_class_1_0_00000001::operator()(&local_11,errorCode);
    fprintf(__stream,"GL_ERROR: %s%s\n",uVar1,pcVar2);
  }
  return errorCode;
}

Assistant:

IGL_INLINE GLenum igl::opengl::report_gl_error(const std::string id)
{
  // http://stackoverflow.com/q/28485180/148668

  // gluErrorString was deprecated
  const auto gluErrorString = [](GLenum errorCode)->const char *
  {
    switch(errorCode)
    {
      default:
        return "unknown error code";
      case GL_NO_ERROR:
        return "no error";
      case GL_INVALID_ENUM:
        return "invalid enumerant";
      case GL_INVALID_VALUE:
        return "invalid value";
      case GL_INVALID_OPERATION:
        return "invalid operation";
#ifndef GL_VERSION_3_0
      case GL_STACK_OVERFLOW:
        return "stack overflow";
      case GL_STACK_UNDERFLOW:
        return "stack underflow";
      case GL_TABLE_TOO_LARGE:
        return "table too large";
#endif
      case GL_OUT_OF_MEMORY:
        return "out of memory";
#ifdef GL_EXT_framebuffer_object
      case GL_INVALID_FRAMEBUFFER_OPERATION_EXT:
        return "invalid framebuffer operation";
#endif
    }
  };

  GLenum err = glGetError();
  if(GL_NO_ERROR != err)
  {
    fprintf(stderr,"GL_ERROR: %s%s\n",id.c_str(),gluErrorString(err));
  }
  return err;
}